

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O1

long Curl_pgrsLimitWaitTime
               (curl_off_t cursize,curl_off_t startsize,curl_off_t limit,timeval start,timeval now)

{
  long lVar1;
  time_t tVar2;
  long lVar3;
  long lVar4;
  
  if (start.tv_sec != 0 || start.tv_usec != 0) {
    lVar3 = -1;
    if (limit <= cursize - startsize) {
      lVar1 = ((cursize - startsize) * 1000) / limit;
      tVar2 = curlx_tvdiff(now,start);
      lVar4 = lVar1 - tVar2;
      lVar3 = 0;
      if (lVar4 != 0 && tVar2 <= lVar1) {
        lVar3 = lVar4;
      }
    }
    return lVar3;
  }
  return 0;
}

Assistant:

long Curl_pgrsLimitWaitTime(curl_off_t cursize,
                            curl_off_t startsize,
                            curl_off_t limit,
                            struct timeval start,
                            struct timeval now)
{
  curl_off_t size = cursize - startsize;
  time_t minimum;
  time_t actual;

  /* we don't have a starting point yet -- return 0 so it gets (re)set */
  if(start.tv_sec == 0 && start.tv_usec == 0)
    return 0;

  /* not enough data yet */
  if(size < limit)
    return -1;

  minimum = (time_t) (CURL_OFF_T_C(1000) * size / limit);
  actual = Curl_tvdiff(now, start);

  if(actual < minimum)
    /* this is a conversion on some systems (64bit time_t => 32bit long) */
    return (long)(minimum - actual);

  return 0;
}